

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

void cvAdjustOrder(CVodeMem cv_mem,int deltaq)

{
  int in_ESI;
  long in_RDI;
  CVodeMem unaff_retaddr;
  int in_stack_ffffffffffffffec;
  
  if ((*(int *)(in_RDI + 0x3c0) != 2) || (in_ESI == 1)) {
    if (*(int *)(in_RDI + 0x20) == 1) {
      cvAdjustAdams(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
    }
    else if (*(int *)(in_RDI + 0x20) == 2) {
      cvAdjustBDF((CVodeMem)CONCAT44(in_ESI,2),in_stack_ffffffffffffffec);
    }
  }
  return;
}

Assistant:

static void cvAdjustOrder(CVodeMem cv_mem, int deltaq)
{
  if ((cv_mem->cv_q == 2) && (deltaq != 1)) { return; }

  switch (cv_mem->cv_lmm)
  {
  case CV_ADAMS: cvAdjustAdams(cv_mem, deltaq); break;
  case CV_BDF: cvAdjustBDF(cv_mem, deltaq); break;
  }
}